

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_connection.hpp
# Opt level: O1

int __thiscall
cpp_client::Connection_internal::connect
          (Connection_internal *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  addrinfo *__ai;
  char cVar1;
  char cVar2;
  int iVar3;
  char *extraout_RAX;
  char *pcVar4;
  runtime_error *prVar5;
  uint uVar6;
  int iVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  addrinfo *paVar9;
  addrinfo *result;
  string port_str;
  addrinfo *local_90;
  char *local_88;
  uint local_80;
  char local_78 [16];
  addrinfo local_68;
  
  uVar8 = (ulong)__addr & 0xffffffff;
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  cVar2 = '\x01';
  if (9 < (uint)__addr) {
    cVar1 = '\x04';
    do {
      cVar2 = cVar1;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        cVar2 = cVar2 + -2;
        goto LAB_0011df87;
      }
      if (uVar6 < 1000) {
        cVar2 = cVar2 + -1;
        goto LAB_0011df87;
      }
      if (uVar6 < 10000) goto LAB_0011df87;
      uVar8 = uVar8 / 10000;
      cVar1 = cVar2 + '\x04';
    } while (99999 < uVar6);
    cVar2 = cVar2 + '\x01';
  }
LAB_0011df87:
  local_88 = local_78;
  iVar7 = 0;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_88,local_80,(uint)__addr);
LAB_0011dfba:
  iVar3 = getaddrinfo((char *)CONCAT44(in_register_00000034,__fd),local_88,&local_68,&local_90);
  __ai = local_90;
  switch(iVar3) {
  case 0:
    for (paVar9 = local_90; paVar9 != (addrinfo *)0x0; paVar9 = paVar9->ai_next) {
      iVar3 = socket(paVar9->ai_family,paVar9->ai_socktype,paVar9->ai_protocol);
      this->sock_ = iVar3;
      if ((iVar3 != -1) &&
         (iVar3 = ::connect(iVar3,paVar9->ai_addr,paVar9->ai_addrlen), iVar3 == -1)) {
        close(this->sock_);
        this->sock_ = -1;
      }
    }
    goto switchD_0011dfe9_caseD_fffffffd;
  case -10:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Could not resolve host name - Out of memory.");
    break;
  default:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Could not resolve host name - Unknown error.");
    break;
  case -4:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Could not resolve host name - Unrecoverable error.");
    break;
  case -3:
    goto switchD_0011dfe9_caseD_fffffffd;
  case -2:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Could not resolve host name - Host not found.");
  }
  *(undefined ***)prVar5 = &PTR__runtime_error_001393d0;
  __cxa_throw(prVar5,&Communication_error::typeinfo,std::runtime_error::~runtime_error);
switchD_0011dfe9_caseD_fffffffd:
  freeaddrinfo(__ai);
  iVar7 = iVar7 + 1;
  if (iVar7 == 3) {
    if (this->sock_ != -1) {
      pcVar4 = local_78;
      if (local_88 != pcVar4) {
        operator_delete(local_88);
        pcVar4 = extraout_RAX;
      }
      return (int)pcVar4;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Could not connect to server.");
    *(undefined ***)prVar5 = &PTR__runtime_error_001393d0;
    __cxa_throw(prVar5,&Communication_error::typeinfo,std::runtime_error::~runtime_error);
  }
  goto LAB_0011dfba;
}

Assistant:

void connect(const char* host, unsigned port)
   {
      struct Free_addr
      {
         addrinfo* info;
         ~Free_addr()
         {
            freeaddrinfo(info);
         }
      };
      // can have temporary name resolution failure so specify a number of tries
      constexpr auto num_tries = 3;
      // set up structures needed
      addrinfo* result;
      addrinfo hints;
      memset(&hints, 0, sizeof(hints));
      hints.ai_family = AF_UNSPEC;
      hints.ai_socktype = SOCK_STREAM;
      hints.ai_protocol = IPPROTO_IP;
      const auto port_str = std::to_string(port);
      // now try to connect
      for(auto i = 0; i < num_tries; ++i)
      {
         const auto resaddr = getaddrinfo(host, port_str.c_str(), &hints, &result);
         // free the memory allocated if going out of scope
         Free_addr dummy{result};
         if(resaddr != 0)
         {
            using ce = Communication_error;
            switch(resaddr)
            {
            case EAI_AGAIN:  continue;
            case EAI_FAIL:   throw ce("Could not resolve host name - Unrecoverable error.");
            case EAI_MEMORY: throw ce("Could not resolve host name - Out of memory.");
            case EAI_NONAME: throw ce("Could not resolve host name - Host not found.");
            default:         throw ce("Could not resolve host name - Unknown error.");
            }
         }
         // now create the socket by trying to connect to all possible addresses
         for(auto ptr = result; ptr; ptr = ptr->ai_next)
         {
            sock_ = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
            if(sock_ == -1)
            {
               continue;
            }
            const auto res = ::connect(sock_, ptr->ai_addr, static_cast<int>(ptr->ai_addrlen));
            if(res == -1)
            {
               close(sock_);
               sock_ = -1;
            }
         }
      }
      // if sock_ is invalid some sort of error occured
      if(sock_ == -1)
      {
         throw Communication_error("Could not connect to server.");
      }
   }